

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O3

void three_parallel_pipelines(size_t L,uint w)

{
  U *pUVar1;
  element_type *peVar2;
  int *piVar3;
  pointer puVar4;
  _func_void *p_Var5;
  pointer *ppuVar6;
  _Head_base<0UL,_tf::Node_*,_false> _Var7;
  bool bVar8;
  size_t *psVar9;
  pthread_mutex_t *__mutex;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  char cVar13;
  size_t f;
  void *pvVar14;
  Node *pNVar15;
  undefined8 *puVar16;
  long *plVar17;
  void *pvVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  _func_int **pp_Var20;
  ulong uVar21;
  long lVar22;
  value_type_conflict3 *__val;
  pointer *__ptr;
  char cVar23;
  pointer puVar24;
  _func_void *p_Var25;
  undefined8 uVar26;
  ulong uVar27;
  long lVar28;
  long in_FS_OFFSET;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  string __str_1;
  promise<void> promise;
  string __str_2;
  atomic<unsigned_long> j3_2;
  size_t j3_1;
  atomic<unsigned_long> j2_3;
  size_t j2_2;
  size_t j2_1;
  size_t j1_4;
  size_t j1_3;
  size_t j1_2;
  size_t j1_1;
  vector<int,_std::allocator<int>_> collection3_2;
  vector<int,_std::allocator<int>_> collection2_3;
  mutex mutex2_3;
  vector<int,_std::allocator<int>_> source;
  size_t cnt3;
  size_t cnt2;
  size_t cnt1;
  mutex mutex3_2;
  Task test3;
  Task pipeline3;
  Task test2;
  Task pipeline2;
  Task test1;
  Task pipeline1;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer3;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> mybuffer2;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> mybuffer1;
  Task terminal;
  Task initial;
  Taskflow taskflow;
  Executor executor;
  future<void> local_a88;
  undefined1 local_a78 [16];
  size_t local_a68;
  ulong local_a60;
  undefined1 local_a58 [18];
  undefined1 uStack_a46;
  undefined1 uStack_a45;
  undefined4 uStack_a44;
  __basic_future<void> local_a38;
  _Any_data local_a28;
  _Invoker_type local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  _Manager_type local_9f8;
  _Invoker_type local_9f0;
  atomic<unsigned_long> local_9e8;
  undefined8 local_9e0;
  exception_ptr local_9d8;
  undefined8 local_9d0;
  undefined1 local_9c8 [16];
  long local_9b8;
  undefined1 local_9a8 [16];
  long local_998;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined8 local_968;
  undefined1 local_958 [16];
  long local_948;
  pthread_mutex_t *local_940;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_938;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_930;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_928;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_920;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_918;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_910;
  size_type local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined8 local_8c8;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_8b8;
  undefined8 uStack_8a0;
  undefined4 local_898;
  ulong local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  _Invoker_type *local_878;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *local_870;
  size_type local_868;
  int local_860;
  ulong local_858;
  undefined1 *local_850;
  undefined8 *local_848;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *local_840;
  size_type local_838;
  undefined8 local_830;
  undefined8 *local_828;
  long lStack_820;
  long local_818;
  vector<tf::Task,_std::allocator<tf::Task>_> local_810;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_7f8;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_790;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_758;
  ulong local_718;
  _Head_base<0UL,_tf::Node_*,_false> local_710;
  _Head_base<0UL,_tf::Node_*,_false> local_708;
  _Head_base<0UL,_tf::Node_*,_false> local_700;
  _Head_base<0UL,_tf::Node_*,_false> local_6f8;
  _Head_base<0UL,_tf::Node_*,_false> local_6f0;
  _Head_base<0UL,_tf::Node_*,_false> local_6e8;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> local_6e0;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> local_6c8;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_6b0;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_698;
  undefined8 uStack_680;
  undefined4 local_678;
  ulong local_670;
  undefined8 *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_650;
  size_type local_648;
  undefined4 local_640;
  ulong local_638;
  undefined1 *local_630;
  _Manager_type *local_628;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_620;
  size_type local_618;
  int local_610;
  ulong local_608;
  undefined1 *local_600;
  _Invoker_type *local_5f8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_5f0;
  size_type local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  undefined1 local_5d0 [16];
  void *local_5c0;
  vector<tf::Task,_std::allocator<tf::Task>_> local_5b8;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_5a0;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_538;
  undefined1 local_500 [32];
  float local_4e0;
  undefined1 local_4d8 [8];
  __node_base_ptr ap_Stack_4d0 [3];
  size_t *local_4b8;
  __node_base *local_4b0;
  __node_base_ptr *local_4a8;
  __node_base *local_4a0;
  undefined1 (*local_498) [16];
  ulong local_490;
  size_t *local_488;
  __node_base *local_480;
  __node_base_ptr *local_478;
  undefined1 (*local_470) [16];
  ulong local_468;
  __node_base *local_460;
  _Head_base<0UL,_tf::Node_*,_false> local_458;
  _Head_base<0UL,_tf::Node_*,_false> local_450;
  __shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2> local_448;
  undefined1 local_430 [80];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  _Map_pointer local_380;
  bool local_370;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_368;
  undefined8 local_350;
  undefined4 local_348;
  ulong local_340;
  undefined1 *local_338;
  atomic<unsigned_long> *local_330;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_328;
  ulong local_320;
  undefined4 local_318;
  ulong local_310;
  undefined1 *local_308;
  undefined8 *local_300;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_2f8;
  ulong local_2f0;
  undefined4 local_2e8;
  ulong local_2e0;
  undefined1 *local_2d8;
  exception_ptr *local_2d0;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_2c8;
  ulong local_2c0;
  int local_2b8;
  ulong local_2b0;
  undefined1 *local_2a8;
  undefined8 *local_2a0;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_298;
  ulong local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  long local_268;
  vector<tf::Task,_std::allocator<tf::Task>_> local_260;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_248;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_230;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1e0;
  undefined1 local_1a8 [32];
  float local_188;
  undefined1 local_180 [16];
  undefined8 local_170;
  Executor local_168;
  
  local_448._M_ptr = (element_type *)0x0;
  local_448._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)w,(shared_ptr<tf::WorkerInterface> *)&local_448);
  if (local_448._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_refcount._M_pi);
  }
  local_958 = (undefined1  [16])0x0;
  local_948 = 0;
  pvVar14 = operator_new(400);
  local_958._0_8_ = pvVar14;
  lVar28 = 0;
  local_948 = (long)pvVar14 + 400;
  memset(pvVar14,0,400);
  local_958._8_8_ = (long)pvVar14 + 400;
  iVar29 = 0;
  iVar30 = 1;
  iVar31 = 2;
  iVar32 = 3;
  do {
    piVar3 = (int *)((long)pvVar14 + lVar28 * 4);
    *piVar3 = iVar29;
    piVar3[1] = iVar30;
    piVar3[2] = iVar31;
    piVar3[3] = iVar32;
    lVar28 = lVar28 + 4;
    iVar29 = iVar29 + 4;
    iVar30 = iVar30 + 4;
    iVar31 = iVar31 + 4;
    iVar32 = iVar32 + 4;
  } while (lVar28 != 100);
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&local_6b0,L,(allocator_type *)&local_368);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&local_6c8,L,(allocator_type *)&local_368);
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            (&local_6e0,L,(allocator_type *)&local_368);
  local_a60 = 0;
  uVar27 = L << 5;
  local_910 = &local_230;
  local_460 = &local_1e0._M_before_begin;
  local_918 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_1a8;
  local_468 = L * 0x18;
  local_930 = &local_538;
  local_928 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_500;
  local_470 = (undefined1 (*) [16])local_4d8;
  local_490 = L << 4;
  local_4a0 = &local_790._M_before_begin;
  local_938 = &local_758;
  local_478 = &local_538._M_single_bucket;
  local_4a8 = &local_758._M_single_bucket;
  local_480 = &local_538._M_before_begin;
  local_4b0 = &local_758._M_before_begin;
  local_920 = &local_1e0;
  local_488 = &local_538._M_rehash_policy._M_next_resize;
  local_4b8 = &local_758._M_rehash_policy._M_next_resize;
  local_498 = (undefined1 (*) [16])&local_828;
  local_940 = (pthread_mutex_t *)&local_168._topology_mutex;
  local_908 = L + 1;
  local_a68 = L;
  local_718 = uVar27;
  do {
    local_430._0_8_ = local_3e0;
    local_430._40_8_ = (__pthread_internal_list *)0x0;
    local_430._24_16_ = (undefined1  [16])0x0;
    local_430._8_16_ = (undefined1  [16])0x0;
    local_430._48_8_ = local_430 + 0x40;
    local_430._56_8_ = 0;
    local_430[0x40] = '\0';
    local_380 = (_Map_pointer)0x0;
    local_390 = (undefined1  [16])0x0;
    local_3a0 = (undefined1  [16])0x0;
    local_3b0 = (undefined1  [16])0x0;
    local_3c0 = (undefined1  [16])0x0;
    local_3d0 = (undefined1  [16])0x0;
    local_3e0 = (undefined1  [16])0x0;
    std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
    ::_M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                         *)(local_3d0 + 8),0);
    local_370 = false;
    local_9d0 = 0;
    local_9d8._M_exception_object = (void *)0x0;
    local_9e0 = 0;
    local_9e8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_8f0 = 1;
    local_368.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348 = 2;
    local_340 = local_a60;
    local_338 = local_958;
    local_330 = &local_9e8;
    local_328 = &local_6b0;
    local_320 = local_a68;
    local_318 = 2;
    local_310 = local_a60;
    local_300 = &local_9e0;
    local_2f0 = local_a68;
    local_2e8 = 2;
    local_2e0 = local_a60;
    local_2d0 = &local_9d8;
    local_2c0 = local_a68;
    local_2b8 = 2;
    local_2b0 = local_a60;
    local_2a0 = &local_9d0;
    local_290 = local_a68;
    local_288 = 0x200000002;
    uStack_280 = 0x200000002;
    local_308 = local_338;
    local_2f8 = local_328;
    local_2d8 = local_338;
    local_2c8 = local_328;
    local_2a8 = local_338;
    local_298 = local_328;
    if (local_a68 >> 0x3a != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    local_278 = (undefined1  [16])0x0;
    local_268 = 0;
    if (local_a68 == 0) {
      local_278._0_8_ = 0;
      lVar28 = 0;
      local_278._8_8_ = 0;
    }
    else {
      pvVar14 = operator_new(uVar27);
      local_278._0_8_ = pvVar14;
      lVar28 = uVar27 + (long)pvVar14;
      memset(pvVar14,0,uVar27);
      local_278._8_8_ = (long)pvVar14 + uVar27;
    }
    local_268 = lVar28;
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_260,local_908,(allocator_type *)&local_698);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_248,local_a68,(allocator_type *)&local_698);
    (local_910->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (local_910->_M_impl).super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map(local_910,0);
    local_1e0._M_buckets = &local_1e0._M_single_bucket;
    local_1e0._M_bucket_count = 1;
    *(undefined1 (*) [16])local_460 = (undefined1  [16])0x0;
    local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0._M_rehash_policy._M_next_resize = 0;
    local_1e0._M_single_bucket = (__node_base_ptr)0x0;
    local_1a8._0_8_ = local_180 + 8;
    local_1a8._8_8_ = 1;
    local_1a8._16_16_ = (undefined1  [16])0x0;
    local_188 = 1.0;
    local_180 = (undefined1  [16])0x0;
    local_170 = 0;
    if (local_a68 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_2b8 != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_350 = 0;
    if (local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar28 = 0x28;
      uVar27 = 0;
      do {
        *(undefined8 *)
         ((long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -0x20) = 0;
        *(ulong *)((long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar28 + -0x28) = uVar27;
        *(undefined8 *)
         ((long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -8) = 0;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)((long)&(local_248.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start)->_line + lVar28));
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x60;
      } while (uVar27 < (ulong)(((long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_920);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_918);
    *(undefined8 *)local_278._0_8_ = 0;
    if (1 < (ulong)(((long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x28;
      do {
        lVar22 = 0;
        do {
          *(long *)(local_278._0_8_ + lVar22 * 8 + lVar28) =
               (long)*(int *)((long)&local_288 + lVar22 * 4 + 4);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x20;
      } while (uVar27 < (ulong)(((long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    lVar28 = 1;
    do {
      *(undefined8 *)(local_278._0_8_ + lVar28 * 8) = 1;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 4);
    if (1 < (ulong)(((long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x20;
      do {
        *(long *)(local_278._0_8_ + lVar28) = (long)(int)local_288 + -1;
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x20;
      } while (uVar27 < (ulong)(((long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    (pNVar15->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)&(pNVar15->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                   *)&local_368;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_invoke;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x04';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_368,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_698);
    if ((Node *)local_698.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_698,
                 (Node *)local_698.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    pNVar15 = local_368.
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    ppuVar6 = &local_698.
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar6;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(local_698.
                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x646e6f63);
    std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
    (local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar15;
    if (local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar6) {
      operator_delete(local_698.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_698.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    if (local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_248.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        puVar16 = (undefined8 *)operator_new(0xd8);
        *puVar16 = 0;
        puVar16[1] = puVar16 + 3;
        puVar16[2] = 0;
        *(undefined1 *)(puVar16 + 3) = 0;
        *(undefined1 (*) [16])(puVar16 + 5) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(puVar16 + 7) = (undefined1  [16])0x0;
        puVar16[9] = puVar16 + 0xc;
        puVar16[10] = puVar16 + 0xc;
        puVar16[0xb] = puVar16 + 0x10;
        puVar16[0x10] = 0;
        puVar16[0x11] =
             (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)&local_368;
        puVar16[0x12] = uVar27;
        puVar16[0x14] =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_invoke;
        puVar16[0x13] =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_manager;
        *(undefined1 *)(puVar16 + 0x18) = 2;
        *(undefined1 (*) [16])(puVar16 + 0x19) = (undefined1  [16])0x0;
        local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar16;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)&local_368,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_698)
        ;
        if ((Node *)local_698.
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_698,
                     (Node *)local_698.
                             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar15 = local_368.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&local_8b8.
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(local_8b8.
                               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2d7472);
        cVar23 = '\x01';
        if (9 < uVar27) {
          uVar21 = uVar27;
          cVar13 = '\x04';
          do {
            cVar23 = cVar13;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_001252a2;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_001252a2;
            }
            if (uVar21 < 10000) goto LAB_001252a2;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar13 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_001252a2:
        local_988._0_8_ = local_978;
        std::__cxx11::string::_M_construct((ulong)local_988,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_988._0_8_,local_988._8_4_,uVar27);
        puVar24 = (pointer)0xf;
        if (local_8b8.
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          puVar24 = local_8b8.
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        puVar4 = (pointer)((long)&((local_8b8.
                                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                  .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl +
                          local_988._8_8_);
        if (puVar24 < puVar4) {
          puVar24 = (pointer)0xf;
          if ((undefined1 *)local_988._0_8_ != local_978) {
            puVar24 = (pointer)local_978._0_8_;
          }
          if (puVar24 < puVar4) goto LAB_0012533c;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)local_988,0,(char *)0x0,
                               (ulong)local_8b8.
                                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
LAB_0012533c:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_8b8,local_988._0_8_);
        }
        local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&local_698.
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        plVar17 = puVar16 + 2;
        if ((pointer *)*puVar16 == (pointer *)plVar17) {
          local_698.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          uStack_680 = puVar16[3];
        }
        else {
          local_698.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_698.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar16;
        }
        local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar16[1];
        *puVar16 = plVar17;
        puVar16[1] = 0;
        *(undefined1 *)plVar17 = 0;
        std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
        local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start[uVar27 + 1]._node = pNVar15;
        if (local_698.
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_698.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_698.
                          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((local_698.
                                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t
                                         ).
                                         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                         .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1)
                         );
        }
        if ((undefined1 *)local_988._0_8_ != local_978) {
          operator_delete((void *)local_988._0_8_,local_978._0_8_ + 1);
        }
        if (local_8b8.
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_8b8.
                          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((local_8b8.
                                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t
                                         ).
                                         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                         .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1)
                         );
        }
        uVar27 = uVar27 + 1;
        tf::Task::precede<tf::Task&>
                  (local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar27);
      } while (uVar27 < (ulong)(((long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    uVar26 = local_430._0_8_;
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    (pNVar15->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      **)&(pNVar15->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = &local_368;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x06';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_698);
    if ((Node *)local_698.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_698,
                 (Node *)local_698.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_698.
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"module_of_pipeline1","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_6e8._M_head_impl = _Var7._M_head_impl;
    if (local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_698.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_698.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_698.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    uVar26 = local_430._0_8_;
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    *(undefined1 (*) [16])&pNVar15->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    plVar17 = (long *)operator_new(0x38);
    *plVar17 = (long)&local_9d0;
    plVar17[1] = (long)(local_a78 + 0x18);
    plVar17[2] = (long)&local_9d8;
    plVar17[3] = (long)&local_9e0;
    plVar17[4] = (long)&local_9e8;
    plVar17[5] = (long)&local_368;
    plVar17[6] = (long)&local_8f0;
    *(long **)&(pNVar15->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ._M_u = plVar17;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1110:35)>
         ::_M_invoke;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1110:35)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_698);
    uVar27 = local_468;
    if ((Node *)local_698.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_698,
                 (Node *)local_698.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_698.
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"test1","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_6f0._M_head_impl = _Var7._M_head_impl;
    if (local_698.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_698.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_698.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_698.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    tf::Task::precede<tf::Task&>((Task *)&local_6e8,(Task *)&local_6f0);
    local_9f0 = (_Invoker_type)0x0;
    local_9f8 = (_Manager_type)0x0;
    local_a00 = 0;
    local_968 = 0;
    local_978 = (undefined1  [16])0x0;
    local_988 = (undefined1  [16])0x0;
    local_998 = 0;
    local_9a8 = (undefined1  [16])0x0;
    local_8f8 = 1;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_698.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678 = 1;
    local_670 = local_a60;
    local_668 = &local_a00;
    local_660 = local_988;
    local_658 = local_9a8;
    local_650 = &local_6c8;
    local_648 = local_a68;
    local_640 = 2;
    local_638 = local_a60;
    local_630 = local_958;
    local_628 = &local_9f8;
    local_618 = local_a68;
    local_610 = 2;
    local_608 = local_a60;
    local_5f8 = &local_9f0;
    local_5e8 = local_a68;
    local_5e0 = 0x200000002;
    local_5d8 = 1;
    local_5c0 = (void *)0x0;
    local_5d0 = (undefined1  [16])0x0;
    local_620 = local_650;
    local_600 = local_630;
    local_5f0 = local_650;
    if (local_a68 == 0) {
      local_5d0._0_8_ = 0;
      pvVar14 = (void *)0x0;
      local_5d0._8_8_ = 0;
    }
    else {
      pvVar18 = operator_new(uVar27);
      local_5d0._0_8_ = pvVar18;
      pvVar14 = (void *)((long)pvVar18 + local_a68 * 0x18);
      memset(pvVar18,0,uVar27);
      local_5d0._8_8_ = (long)pvVar18 + uVar27;
    }
    local_5c0 = pvVar14;
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_5b8,local_908,(allocator_type *)&local_8b8);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_5a0,local_a68,(allocator_type *)&local_8b8);
    local_548 = (undefined1  [16])0x0;
    local_558 = (undefined1  [16])0x0;
    local_568 = (undefined1  [16])0x0;
    local_578 = (undefined1  [16])0x0;
    local_588 = (undefined1  [16])0x0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)local_588,0);
    local_538._M_buckets = local_478;
    local_538._M_bucket_count = 1;
    *(undefined1 (*) [16])local_480 = (undefined1  [16])0x0;
    local_538._M_rehash_policy._M_max_load_factor = 1.0;
    psVar9 = local_488;
    psVar9[0] = 0;
    pauVar12 = local_470;
    psVar9[1] = 0;
    local_500._0_8_ = ap_Stack_4d0;
    local_500._8_8_ = 1;
    local_500._16_16_ = (undefined1  [16])0x0;
    local_4e0 = 1.0;
    *local_470 = (undefined1  [16])0x0;
    *(undefined8 *)pauVar12[1] = 0;
    if (local_a68 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_610 != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    uStack_680 = 0;
    if (local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar28 = 0x28;
      uVar27 = 0;
      do {
        *(undefined8 *)
         ((long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -0x20) = 0;
        *(ulong *)((long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar28 + -0x28) = uVar27;
        *(undefined8 *)
         ((long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -8) = 0;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)((long)&(local_5a0.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start)->_line + lVar28));
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x60;
      } while (uVar27 < (ulong)(((long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_930);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_928);
    *(undefined8 *)local_5d0._0_8_ = 0;
    if (1 < (ulong)(((long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x20;
      do {
        lVar22 = 0;
        do {
          *(long *)(local_5d0._0_8_ + lVar22 * 8 + lVar28) =
               (long)*(int *)((long)&local_5e0 + lVar22 * 4 + 4);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 2);
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x18;
      } while (uVar27 < (ulong)(((long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    *(undefined8 *)(local_5d0._0_8_ + 8) = 1;
    *(undefined8 *)(local_5d0._0_8_ + 0x10) = 1;
    if (1 < (ulong)(((long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x18;
      do {
        *(long *)(local_5d0._0_8_ + lVar28) = (long)(int)local_5e0 + -1;
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x18;
      } while (uVar27 < (ulong)(((long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    (pNVar15->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)&(pNVar15->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                   *)&local_698;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_invoke;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x04';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_698,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_8b8);
    if ((Node *)local_8b8.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_8b8,
                 (Node *)local_8b8.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    pNVar15 = local_698.
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    ppuVar6 = &local_8b8.
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar6;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT35(local_8b8.
                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,0x646e6f63);
    std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
    (local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar15;
    if (local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar6) {
      operator_delete(local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_8b8.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    if (local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_5a0.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        puVar16 = (undefined8 *)operator_new(0xd8);
        *puVar16 = 0;
        puVar16[1] = puVar16 + 3;
        puVar16[2] = 0;
        *(undefined1 *)(puVar16 + 3) = 0;
        *(undefined1 (*) [16])(puVar16 + 5) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(puVar16 + 7) = (undefined1  [16])0x0;
        puVar16[9] = puVar16 + 0xc;
        puVar16[10] = puVar16 + 0xc;
        puVar16[0xb] = puVar16 + 0x10;
        puVar16[0x10] = 0;
        puVar16[0x11] =
             (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)&local_698;
        puVar16[0x12] = uVar27;
        puVar16[0x14] =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_invoke;
        puVar16[0x13] =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_manager;
        *(undefined1 *)(puVar16 + 0x18) = 2;
        *(undefined1 (*) [16])(puVar16 + 0x19) = (undefined1  [16])0x0;
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar16;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)&local_698,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_8b8)
        ;
        if ((Node *)local_8b8.
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_8b8,
                     (Node *)local_8b8.
                             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        auVar10 = local_8d8;
        pNVar15 = local_698.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        local_8d8._0_3_ = 0x2d0000;
        local_8d8._0_2_ = 0x7472;
        auVar11 = local_8d8;
        local_8e8._8_8_ = 3;
        local_8e8._0_8_ = local_8d8;
        local_8d8._4_12_ = auVar10._4_12_;
        local_8d8._0_3_ = auVar11._0_3_;
        local_8d8[3] = 0;
        cVar23 = '\x01';
        if (9 < uVar27) {
          uVar21 = uVar27;
          cVar13 = '\x04';
          do {
            cVar23 = cVar13;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_00125e34;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_00125e34;
            }
            if (uVar21 < 10000) goto LAB_00125e34;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar13 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_00125e34:
        local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a78;
        std::__cxx11::string::_M_construct((ulong)&local_a88,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_a88.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,
                   (uint)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,uVar27);
        pvVar14 = (void *)0xf;
        if ((undefined1 *)local_8e8._0_8_ != local_8d8) {
          pvVar14 = (void *)local_8d8._0_8_;
        }
        pvVar18 = (void *)((long)&(local_a88.super___basic_future<void>._M_state.
                                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_vptr__Sp_counted_base + local_8e8._8_8_);
        if (pvVar14 < pvVar18) {
          pvVar14 = (void *)0xf;
          if ((_Any_data *)
              local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (_Any_data *)local_a78) {
            pvVar14 = (void *)local_a78._0_8_;
          }
          if (pvVar14 < pvVar18) goto LAB_00125eae;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_a88,0,(char *)0x0,local_8e8._0_8_);
        }
        else {
LAB_00125eae:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              (local_8e8,
                               (ulong)local_a88.super___basic_future<void>._M_state.
                                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
        }
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&local_8b8.
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        plVar17 = puVar16 + 2;
        if ((pointer *)*puVar16 == (pointer *)plVar17) {
          local_8b8.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          uStack_8a0 = puVar16[3];
        }
        else {
          local_8b8.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_8b8.
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar16;
        }
        local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar16[1];
        *puVar16 = plVar17;
        puVar16[1] = 0;
        *(undefined1 *)plVar17 = 0;
        std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
        local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start[uVar27 + 1]._node = pNVar15;
        if (local_8b8.
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_8b8.
                          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((local_8b8.
                                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t
                                         ).
                                         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                         .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1)
                         );
        }
        if ((_Any_data *)
            local_a88.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (_Any_data *)local_a78) {
          operator_delete(local_a88.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_a78._0_8_ + 1);
        }
        if ((undefined1 *)local_8e8._0_8_ != local_8d8) {
          operator_delete((void *)local_8e8._0_8_,local_8d8._0_8_ + 1);
        }
        uVar27 = uVar27 + 1;
        tf::Task::precede<tf::Task&>
                  (local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar27);
      } while (uVar27 < (ulong)(((long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_5a0.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    uVar26 = local_430._0_8_;
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    (pNVar15->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      **)&(pNVar15->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = &local_698;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x06';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_8b8);
    if ((Node *)local_8b8.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_8b8,
                 (Node *)local_8b8.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_8b8.
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"module_of_pipeline2","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_6f8._M_head_impl = _Var7._M_head_impl;
    if (local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_8b8.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_8b8.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    uVar26 = local_430._0_8_;
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    *(undefined1 (*) [16])&pNVar15->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    plVar17 = (long *)operator_new(0x38);
    *plVar17 = (long)&local_9f0;
    plVar17[1] = (long)(local_a78 + 0x18);
    plVar17[2] = (long)&local_9f8;
    plVar17[3] = (long)&local_a00;
    plVar17[4] = (long)local_9a8;
    plVar17[5] = (long)&local_698;
    plVar17[6] = (long)&local_8f8;
    *(long **)&(pNVar15->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ._M_u = plVar17;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1161:35)>
         ::_M_invoke;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1161:35)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_8b8);
    if ((Node *)local_8b8.
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_8b8,
                 (Node *)local_8b8.
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_8b8.
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"test2","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    uVar27 = local_490;
    local_700._M_head_impl = _Var7._M_head_impl;
    if (local_8b8.
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_8b8.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_8b8.
                      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_8b8.
                                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>
                                     .super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl + 1));
    }
    tf::Task::precede<tf::Task&>((Task *)&local_6f8,(Task *)&local_700);
    pauVar12 = local_498;
    local_a08 = 0;
    local_a10 = (_Invoker_type)0x0;
    local_8c8 = 0;
    local_8d8 = (undefined1  [16])0x0;
    local_8e8 = (undefined1  [16])0x0;
    local_9b8 = 0;
    local_9c8 = (undefined1  [16])0x0;
    local_900 = 1;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8b8.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_898 = 1;
    local_890 = local_a60;
    local_888 = local_9c8;
    local_880 = local_8e8;
    local_878 = &local_a10;
    local_870 = &local_6e0;
    local_868 = local_a68;
    local_860 = 2;
    local_858 = local_a60;
    local_850 = local_958;
    local_848 = &local_a08;
    local_838 = local_a68;
    local_830 = 0x100000002;
    *(undefined8 *)local_498[1] = 0;
    *pauVar12 = (undefined1  [16])0x0;
    local_840 = local_870;
    if (local_a68 == 0) {
      local_828 = (undefined8 *)0x0;
      lVar28 = 0;
      lStack_820 = 0;
    }
    else {
      puVar16 = (undefined8 *)operator_new(uVar27);
      lVar28 = (long)puVar16 + uVar27;
      local_828 = puVar16;
      memset(puVar16,0,uVar27);
      lStack_820 = (long)puVar16 + uVar27;
    }
    local_818 = lVar28;
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_810,local_908,(allocator_type *)&local_a88);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_7f8,local_a68,(allocator_type *)&local_a88);
    local_7a0 = (undefined1  [16])0x0;
    local_7b0 = (undefined1  [16])0x0;
    local_7c0 = (undefined1  [16])0x0;
    local_7d0 = (undefined1  [16])0x0;
    local_7e0 = (undefined1  [16])0x0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)local_7e0,0);
    local_790._M_buckets = &local_790._M_single_bucket;
    local_790._M_bucket_count = 1;
    *(undefined1 (*) [16])local_4a0 = (undefined1  [16])0x0;
    local_790._M_rehash_policy._M_max_load_factor = 1.0;
    local_790._M_rehash_policy._M_next_resize = 0;
    local_790._M_single_bucket = (__node_base_ptr)0x0;
    local_758._M_buckets = local_4a8;
    local_758._M_bucket_count = 1;
    *(undefined1 (*) [16])local_4b0 = (undefined1  [16])0x0;
    psVar9 = local_4b8;
    local_758._M_rehash_policy._M_max_load_factor = 1.0;
    psVar9[0] = 0;
    psVar9[1] = 0;
    *(undefined8 *)*(undefined1 (*) [16])(psVar9 + 2) = 0;
    if (local_a68 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_860 != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    uStack_8a0 = 0;
    if (local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar28 = 0x28;
      uVar27 = 0;
      do {
        *(undefined8 *)
         ((long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -0x20) = 0;
        *(ulong *)((long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar28 + -0x28) = uVar27;
        *(undefined8 *)
         ((long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar28 + -8) = 0;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)((long)&(local_7f8.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start)->_line + lVar28));
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x60;
      } while (uVar27 < (ulong)(((long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_790);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_938);
    *local_828 = 0;
    if (1 < (ulong)(((long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x18;
      do {
        *(long *)((long)local_828 + lVar28) = (long)local_830._4_4_;
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x10;
      } while (uVar27 < (ulong)(((long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    local_828[1] = 1;
    if (1 < (ulong)(((long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar27 = 1;
      lVar28 = 0x10;
      do {
        *(long *)((long)local_828 + lVar28) = (long)(int)local_830 + -1;
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x10;
      } while (uVar27 < (ulong)(((long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_a88.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_a88.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_a88.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)&(((Node *)local_a88.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                   *)&local_8b8;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x04';
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_8b8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88);
    if ((Node *)local_a88.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_a88,
                 (Node *)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    pNVar15 = local_8b8.
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
    local_a78._0_5_ = 0x646e6f63;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a78;
    std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
    (local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar15;
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a78) {
      operator_delete(local_a88.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_a78._0_8_ + 1);
    }
    if (local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_7f8.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar27 = 0;
      do {
        local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0xd8);
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_nstate = 0;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_estate = (__atomic_base<int>)0x0;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_dataplus._M_p =
             (pointer)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_name).field_2;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_string_length = 0;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
        pUVar1 = &(((Node *)local_a88.super___basic_future<void>._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_data = (void *)0x0;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_topology = (Topology *)0x0;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_parent = (Node *)0x0;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_num_successors = 0;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
             &((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_join_counter;
        (((Node *)local_a88.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
        *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
          **)&(((Node *)local_a88.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                       *)&local_8b8;
        *(ulong *)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 8) = uVar27;
        *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x18) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_invoke;
        *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x10) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_manager;
        *(__index_type *)
         ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) = '\x02';
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_semaphores =
             (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
              )0x0;
        ((Node *)local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_exception_ptr = (void *)0x0;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)&local_8b8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88)
        ;
        if ((Node *)local_a88.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_a88,
                     (Node *)local_a88.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        pNVar15 = local_8b8.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        local_a58._0_8_ = local_a58 + 0x10;
        uStack_a46 = 0x2d;
        local_a58._16_2_ = 0x7472;
        local_a58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
        uStack_a45 = 0;
        cVar23 = '\x01';
        if (9 < uVar27) {
          uVar21 = uVar27;
          cVar13 = '\x04';
          do {
            cVar23 = cVar13;
            if (uVar21 < 100) {
              cVar23 = cVar23 + -2;
              goto LAB_001268cc;
            }
            if (uVar21 < 1000) {
              cVar23 = cVar23 + -1;
              goto LAB_001268cc;
            }
            if (uVar21 < 10000) goto LAB_001268cc;
            bVar8 = 99999 < uVar21;
            uVar21 = uVar21 / 10000;
            cVar13 = cVar23 + '\x04';
          } while (bVar8);
          cVar23 = cVar23 + '\x01';
        }
LAB_001268cc:
        local_a38._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_a28;
        std::__cxx11::string::_M_construct((ulong)&local_a38,cVar23);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_a38._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,
                   (uint)local_a38._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,uVar27);
        p_Var25 = (_func_void *)0xf;
        if ((Topology *)local_a58._0_8_ != (Topology *)(local_a58 + 0x10)) {
          p_Var25 = (_func_void *)
                    CONCAT44(uStack_a44,CONCAT13(uStack_a45,CONCAT12(uStack_a46,local_a58._16_2_)));
        }
        p_Var5 = (_func_void *)
                 ((long)(_func_int ***)local_a58._8_8_ +
                 CONCAT44(local_a38._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          (uint)local_a38._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi));
        if (p_Var25 < p_Var5) {
          uVar26 = (_func_void *)0xf;
          if ((_Any_data *)
              local_a38._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != &local_a28) {
            uVar26 = local_a28._M_unused._0_8_;
          }
          if ((ulong)uVar26 < p_Var5) goto LAB_0012693f;
          plVar17 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_a38,0,(char *)0x0,local_a58._0_8_);
        }
        else {
LAB_0012693f:
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      (local_a58,
                                       (ulong)local_a38._M_state.
                                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
        }
        local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a78;
        peVar2 = (element_type *)(plVar17 + 2);
        if ((element_type *)*plVar17 == peVar2) {
          local_a78 = *(undefined1 (*) [16])peVar2;
        }
        else {
          local_a78._0_8_ = peVar2->_vptr__State_baseV2;
          local_a88.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar17;
        }
        local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar17[1];
        *plVar17 = (long)peVar2;
        plVar17[1] = 0;
        *(undefined1 *)&peVar2->_vptr__State_baseV2 = 0;
        std::__cxx11::string::_M_assign((string *)&pNVar15->_name);
        local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start[uVar27 + 1]._node = pNVar15;
        if (local_a88.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)local_a78) {
          operator_delete(local_a88.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_a78._0_8_ + 1);
        }
        if ((_Any_data *)
            local_a38._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != &local_a28) {
          operator_delete(local_a38._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(ulong)(local_a28._M_unused._M_member_pointer + 1));
        }
        if ((Topology *)local_a58._0_8_ != (Topology *)(local_a58 + 0x10)) {
          operator_delete((void *)local_a58._0_8_,
                          CONCAT44(uStack_a44,
                                   CONCAT13(uStack_a45,CONCAT12(uStack_a46,local_a58._16_2_))) + 1);
        }
        uVar27 = uVar27 + 1;
        tf::Task::precede<tf::Task&>
                  (local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar27);
      } while (uVar27 < (ulong)(((long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_7f8.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    uVar26 = local_430._0_8_;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_a88.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_a88.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_a88.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      **)&(((Node *)local_a88.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = &local_8b8;
    *(__index_type *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x06';
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88);
    if ((Node *)local_a88.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_a88,
                 (Node *)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"module_of_pipeline3","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_708._M_head_impl = _Var7._M_head_impl;
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a78) {
      operator_delete(local_a88.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_a78._0_8_ + 1);
    }
    uVar26 = local_430._0_8_;
    pNVar15 = (Node *)operator_new(0xd8);
    pNVar15->_nstate = 0;
    pNVar15->_estate = (__atomic_base<int>)0x0;
    (pNVar15->_name)._M_dataplus._M_p = (pointer)&(pNVar15->_name).field_2;
    (pNVar15->_name)._M_string_length = 0;
    (pNVar15->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar15->_data = (void *)0x0;
    pNVar15->_topology = (Topology *)0x0;
    pNVar15->_parent = (Node *)0x0;
    pNVar15->_num_successors = 0;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar15->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar15->_join_counter;
    *(undefined1 (*) [16])&pNVar15->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    plVar17 = (long *)operator_new(0x30);
    *plVar17 = (long)&local_a08;
    plVar17[1] = (long)(local_a78 + 0x18);
    plVar17[2] = (long)&local_a10;
    plVar17[3] = (long)local_9c8;
    plVar17[4] = (long)&local_8b8;
    plVar17[5] = (long)&local_900;
    *(long **)&(pNVar15->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ._M_u = plVar17;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1210:35)>
         ::_M_invoke;
    *(code **)((long)&(pNVar15->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1210:35)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar15->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    pNVar15->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar15->_exception_ptr = (void *)0x0;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pNVar15;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88);
    uVar27 = local_718;
    if ((Node *)local_a88.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_a88,
                 (Node *)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"test3","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_710._M_head_impl = _Var7._M_head_impl;
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a78) {
      operator_delete(local_a88.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_a78._0_8_ + 1);
    }
    tf::Task::precede<tf::Task&>((Task *)&local_708,(Task *)&local_710);
    uVar26 = local_430._0_8_;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_a88.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_a88.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_a88.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    *(undefined1 (*) [16])
     &((Node *)local_a88.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_join_counter = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1224:38)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1224:38)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88);
    if ((Node *)local_a88.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_a88,
                 (Node *)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"initial","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_450._M_head_impl = _Var7._M_head_impl;
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a78) {
      operator_delete(local_a88.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_a78._0_8_ + 1);
    }
    uVar26 = local_430._0_8_;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_a88.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_a88.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_a88.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_a88.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    *(undefined1 (*) [16])
     &((Node *)local_a88.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_join_counter = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1225:38)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1225:38)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_a88.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_a88.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar26,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_a88);
    if ((Node *)local_a88.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_a88,
                 (Node *)local_a88.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar26)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_a88.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"terminal","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_458._M_head_impl = _Var7._M_head_impl;
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a78) {
      operator_delete(local_a88.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_a78._0_8_ + 1);
    }
    tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
              ((Task *)&local_450,(Task *)&local_6e8,(Task *)&local_6f8,(Task *)&local_708);
    tf::Task::succeed<tf::Task&,tf::Task&,tf::Task&>
              ((Task *)&local_458,(Task *)&local_6f0,(Task *)&local_700,(Task *)&local_710);
    __mutex = local_940;
    iVar29 = pthread_mutex_lock(local_940);
    if (iVar29 != 0) {
      std::__throw_system_error(iVar29);
    }
    local_168._num_topologies = local_168._num_topologies + 1;
    pthread_mutex_unlock(__mutex);
    if (local_3e0._0_8_ == local_3e0._8_8_) {
      local_9e8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      local_9e0 = 0;
      local_9d8._M_exception_object = (void *)0x0;
      local_9d0 = 0;
      if ((long)local_6b0.
                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_6b0.
                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        lVar28 = (long)local_6b0.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6b0.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        memset(local_6b0.
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0,(lVar28 + (ulong)(lVar28 == 0)) * 0x10);
      }
      local_8f0 = local_8f0 + 1;
      LOCK();
      local_a00 = 0;
      UNLOCK();
      local_9f8 = (_Manager_type)0x0;
      local_9f0 = (_Invoker_type)0x0;
      if (local_9a8._8_8_ != local_9a8._0_8_) {
        local_9a8._8_8_ = local_9a8._0_8_;
      }
      if ((long)local_6c8.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_6c8.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        lVar28 = ((long)local_6c8.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_6c8.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        memset(local_6c8.
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0,(lVar28 + (ulong)(lVar28 == 0)) * 0xc);
      }
      local_8f8 = local_8f8 + 1;
      LOCK();
      local_a10 = (_Invoker_type)0x0;
      UNLOCK();
      local_a08 = 0;
      if (local_9c8._8_8_ != local_9c8._0_8_) {
        local_9c8._8_8_ = local_9c8._0_8_;
      }
      if ((long)local_6e0.
                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_6e0.
                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        lVar28 = (long)local_6e0.
                       super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6e0.
                       super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        memset(local_6e0.
               super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0,(lVar28 + (ulong)(lVar28 == 0)) * 8);
      }
      local_900 = local_900 + 1;
      std::promise<void>::promise((promise<void> *)local_a58);
      std::promise<void>::set_value((promise<void> *)local_a58);
      iVar29 = pthread_mutex_lock(local_940);
      if (iVar29 != 0) {
        std::__throw_system_error(iVar29);
      }
      local_168._num_topologies = local_168._num_topologies - 1;
      if (local_168._num_topologies == 0) {
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock(local_940);
      std::__basic_future<void>::__basic_future(&local_a38,(__state_type *)local_a58);
      local_a88.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_a38._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_,
                       (uint)local_a38._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      local_a88.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_a38._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a78 = (undefined1  [16])0x0;
      std::promise<void>::~promise((promise<void> *)local_a58);
    }
    else {
      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
      p_Var19->_M_use_count = 1;
      p_Var19->_M_weak_count = 1;
      p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00186ce0;
      p_Var19[1]._vptr__Sp_counted_base = (_func_int **)local_430;
      std::promise<void>::promise((promise<void> *)&p_Var19[1]._M_use_count);
      p_Var19[3]._M_use_count = 0;
      p_Var19[3]._M_weak_count = 0;
      p_Var19[3]._vptr__Sp_counted_base = (_func_int **)0x2;
      *(code **)&p_Var19[4]._M_use_count =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      p_Var19[4]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      p_Var19[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var19[5]._M_use_count = 0;
      p_Var19[5]._M_weak_count = 0;
      p_Var19[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var19[6]._M_use_count = 0;
      p_Var19[6]._M_weak_count = 0;
      pp_Var20 = (_func_int **)operator_new(0x88);
      *pp_Var20 = (_func_int *)&local_9d0;
      pp_Var20[1] = (_func_int *)&local_9d8;
      pp_Var20[2] = (_func_int *)&local_9e0;
      pp_Var20[3] = (_func_int *)&local_9e8;
      pp_Var20[4] = (_func_int *)&local_6b0;
      pp_Var20[5] = (_func_int *)&local_8f0;
      pp_Var20[6] = (_func_int *)&local_9f0;
      pp_Var20[7] = (_func_int *)&local_9f8;
      pp_Var20[8] = (_func_int *)&local_a00;
      pp_Var20[9] = (_func_int *)local_9a8;
      pp_Var20[10] = (_func_int *)&local_6c8;
      pp_Var20[0xb] = (_func_int *)&local_8f8;
      pp_Var20[0xc] = (_func_int *)&local_a08;
      pp_Var20[0xd] = (_func_int *)&local_a10;
      pp_Var20[0xe] = (_func_int *)local_9c8;
      pp_Var20[0xf] = (_func_int *)&local_6e0;
      pp_Var20[0x10] = (_func_int *)&local_900;
      p_Var19[5]._vptr__Sp_counted_base = pp_Var20;
      *(code **)&p_Var19[6]._M_use_count =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1232:33)>
           ::_M_invoke;
      p_Var19[6]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1232:33)>
           ::_M_manager;
      p_Var19[7]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var19[7]._M_use_count = 0;
      p_Var19[8]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_a58._0_8_ = (Topology *)(p_Var19 + 1);
      local_a58._8_8_ = p_Var19;
      std::__basic_future<void>::__basic_future(&local_a38,(__state_type *)&p_Var19[1]._M_use_count)
      ;
      uVar27 = local_718;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var19->_M_weak_count = p_Var19->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var19->_M_weak_count = p_Var19->_M_weak_count + 1;
      }
      local_a88.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_a38._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_,
                       (uint)local_a38._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      local_a88.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_a38._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a78._8_8_ = p_Var19;
      local_a78._0_8_ = (Topology *)(p_Var19 + 1);
      iVar29 = pthread_mutex_lock((pthread_mutex_t *)(local_430 + 8));
      if (iVar29 != 0) {
        std::__throw_system_error(iVar29);
      }
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back((deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                 *)(local_3d0 + 8),(value_type *)local_a58);
      if (((long)(local_3b0._8_8_ - local_3c0._8_8_) >> 4) +
          ((long)(local_3a0._8_8_ - local_390._0_8_) >> 4) +
          ((((ulong)((long)local_380 - local_3a0._0_8_) >> 3) - 1) +
          (ulong)(local_380 == (_Map_pointer)0x0)) * 0x20 == 1) {
        tf::Executor::_set_up_topology
                  (&local_168,*(Worker **)(in_FS_OFFSET + -8),(Topology *)local_a58._0_8_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)(local_430 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a58._8_8_);
      }
    }
    std::future<void>::get(&local_a88);
    if ((long *)local_a78._8_8_ != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar3 = (int *)(local_a78._8_8_ + 0xc);
        iVar29 = *piVar3;
        *piVar3 = *piVar3 + -1;
        UNLOCK();
      }
      else {
        iVar29 = *(int *)(local_a78._8_8_ + 0xc);
        *(int *)(local_a78._8_8_ + 0xc) = iVar29 + -1;
      }
      if (iVar29 == 1) {
        (**(code **)(*(long *)local_a78._8_8_ + 0x18))();
      }
    }
    if (local_a88.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a88.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_938);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_790);
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)local_7e0);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_7f8);
    if (local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_810.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_828 != (undefined8 *)0x0) {
      operator_delete(local_828,local_818 - (long)local_828);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::~vector(&local_8b8);
    if ((void *)local_9c8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_9c8._0_8_,local_9b8 - local_9c8._0_8_);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_928);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_930);
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)local_588);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_5a0);
    if (local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5b8.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((void *)local_5d0._0_8_ != (void *)0x0) {
      operator_delete((void *)local_5d0._0_8_,(long)local_5c0 - local_5d0._0_8_);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::~vector(&local_698);
    if ((void *)local_9a8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_9a8._0_8_,local_998 - local_9a8._0_8_);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_918);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_920);
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(local_910);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_248);
    if (local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((void *)local_278._0_8_ != (void *)0x0) {
      operator_delete((void *)local_278._0_8_,local_268 - local_278._0_8_);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::~vector(&local_368);
    tf::Taskflow::~Taskflow((Taskflow *)local_430);
    local_a60 = local_a60 + 1;
    if (100 < local_a60) {
      if (local_6e0.super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6e0.
                        super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_6e0.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6e0.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6c8.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6c8.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_6c8.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6c8.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6b0.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6b0.
                        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_6b0.
                              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6b0.
                              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_958._0_8_ != (void *)0x0) {
        operator_delete((void *)local_958._0_8_,local_948 - local_958._0_8_);
      }
      tf::Executor::~Executor(&local_168);
      return;
    }
  } while( true );
}

Assistant:

void three_parallel_pipelines(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 4>> mybuffer1(L);
  std::vector<std::array<int, 3>> mybuffer2(L);
  std::vector<std::array<int, 2>> mybuffer3(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1_1 = 0, j1_2 = 0, j1_3 = 0, j1_4 = 0;
    size_t cnt1 = 1;

    // pipeline 1 is SSSS
    tf::Pipeline pl1(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_1, &mybuffer1, L](auto& pf) mutable {
        if(j1_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1_1 == source[j1_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer1[pf.line()][pf.pipe()] = source[j1_1] + 1;
        j1_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_2, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_2 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_2] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_2] + 1;
        j1_2++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_3, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_3] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_3] + 1;
        j1_3++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_4, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_4 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_4] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        j1_4++;
      }}
    );

    auto pipeline1 = taskflow.composed_of(pl1).name("module_of_pipeline1");
    auto test1 = taskflow.emplace([&](){
      REQUIRE(j1_1 == N);
      REQUIRE(j1_2 == N);
      REQUIRE(j1_3 == N);
      REQUIRE(j1_4 == N);
      REQUIRE(pl1.num_tokens() == cnt1 * N);
    }).name("test1");

    pipeline1.precede(test1);



    // the followings are definitions for pipeline 2
    size_t j2_1 = 0, j2_2 = 0;
    std::atomic<size_t> j2_3 = 0;
    std::mutex mutex2_3;
    std::vector<int> collection2_3;
    size_t cnt2 = 1;

    // pipeline 2 is SSP
    tf::Pipeline pl2(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_1, &mybuffer2, L](auto& pf) mutable {
        if(j2_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j2_1 == source[j2_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_1] + 1;
        j2_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_2, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_2 < N);
        REQUIRE(source[j2_2] + 1 == mybuffer2[pf.line()][pf.pipe() - 1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_2] + 1;
        j2_2++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j2_3, &mutex2_3, &collection2_3, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_3++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex2_3);
          REQUIRE(pf.token() % L == pf.line());
          collection2_3.push_back(mybuffer2[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline2 = taskflow.composed_of(pl2).name("module_of_pipeline2");
    auto test2 = taskflow.emplace([&](){
      REQUIRE(j2_1 == N);
      REQUIRE(j2_2 == N);
      REQUIRE(j2_3 == N);
      REQUIRE(collection2_3.size() == N);

      std::sort(collection2_3.begin(), collection2_3.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection2_3[i] == i + 1);
      }
      REQUIRE(pl2.num_tokens() == cnt2 * N);
    }).name("test2");

    pipeline2.precede(test2);



    // the followings are definitions for pipeline 3
    size_t j3_1 = 0;
    std::atomic<size_t> j3_2 = 0;
    std::mutex mutex3_2;
    std::vector<int> collection3_2;
    size_t cnt3 = 1;

    // pipeline 3 is SP
    tf::Pipeline pl3(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j3_1, &mybuffer3, L](auto& pf) mutable {
        if(j3_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j3_1 == source[j3_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer3[pf.line()][pf.pipe()] = source[j3_1] + 1;
        j3_1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection3_2, &mutex3_2, &j3_2, &mybuffer3, L](auto& pf) mutable {
        REQUIRE(j3_2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex3_2);
          REQUIRE(pf.token() % L == pf.line());
          collection3_2.push_back(mybuffer3[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline3 = taskflow.composed_of(pl3).name("module_of_pipeline3");
    auto test3 = taskflow.emplace([&](){
      REQUIRE(j3_1 == N);
      REQUIRE(j3_2 == N);

      std::sort(collection3_2.begin(), collection3_2.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection3_2[i] == i + 1);
      }
      REQUIRE(pl3.num_tokens() == cnt3 * N);
    }).name("test3");

    pipeline3.precede(test3);


    auto initial  = taskflow.emplace([](){}).name("initial");
    auto terminal = taskflow.emplace([](){}).name("terminal");

    initial.precede(pipeline1, pipeline2, pipeline3);
    terminal.succeed(test1, test2, test3);

    //taskflow.dump(std::cout);

    executor.run_n(taskflow, 3, [&]() mutable {
      // reset variables for pipeline 1
      j1_1 = j1_2 = j1_3 = j1_4 = 0;
      for(size_t i = 0; i < mybuffer1.size(); ++i){
        for(size_t j = 0; j < mybuffer1[0].size(); ++j){
          mybuffer1[i][j] = 0;
        }
      }
      cnt1++;

      // reset variables for pipeline 2
      j2_1 = j2_2 = j2_3 = 0;
      collection2_3.clear();
      for(size_t i = 0; i < mybuffer2.size(); ++i){
        for(size_t j = 0; j < mybuffer2[0].size(); ++j){
          mybuffer2[i][j] = 0;
        }
      }
      cnt2++;

      // reset variables for pipeline 3
      j3_1 = j3_2 = 0;
      collection3_2.clear();
      for(size_t i = 0; i < mybuffer3.size(); ++i){
        for(size_t j = 0; j < mybuffer3[0].size(); ++j){
          mybuffer3[i][j] = 0;
        }
      }
      cnt3++;
    }).get();


  }
}